

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

double __thiscall mp::PLTerm::slope(PLTerm *this,int index)

{
  Impl *pIVar1;
  AssertionFailure *this_00;
  
  if ((-1 < index) &&
     (pIVar1 = (this->super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>).super_ExprBase.impl_,
     index <= (int)pIVar1[1].kind_)) {
    return *(double *)(pIVar1 + (ulong)(uint)(index * 2) * 2 + 4);
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"index out of bounds");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

double slope(int index) const {
    MP_ASSERT(index >= 0 && index < num_slopes(), "index out of bounds");
    return impl()->data[2 * index];
  }